

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O2

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        *this,int newMax,int newSize)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  undefined4 *puVar5;
  ulong uVar6;
  ptrdiff_t pVar7;
  long lVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newMem;
  uint local_38;
  uint local_34;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  local_38 = 1;
  if (1 < newMax) {
    local_38 = newMax;
  }
  if (local_38 == this->themax) {
    this->thesize = newSize;
    pVar7 = 0;
  }
  else {
    newMem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&newMem,local_38);
    lVar8 = -0x80;
    lVar4 = 0;
    local_34 = newSize;
    for (uVar6 = 0;
        (uVar2 = local_34, uVar1 = local_38, (long)uVar6 < (long)newSize &&
        ((long)uVar6 < (long)this->thesize)); uVar6 = uVar6 + 1) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)(newMem->val).m_backend.data._M_elems + lVar4),
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)(this->data->val).m_backend.data._M_elems + lVar4));
      lVar8 = lVar8 + -0x84;
      lVar4 = lVar4 + 0x84;
    }
    uVar3 = (ulong)local_38;
    if (local_38 < uVar6) {
      uVar3 = uVar6;
    }
    puVar5 = (undefined4 *)((long)newMem - lVar8);
    for (; uVar6 != uVar3; uVar3 = uVar3 - 1) {
      *(undefined8 *)(puVar5 + -2) = 0x1c00000000;
      *(undefined8 *)(puVar5 + -0x20) = 0;
      *(undefined8 *)(puVar5 + -0x1e) = 0;
      *(undefined8 *)(puVar5 + -0x1c) = 0;
      *(undefined8 *)(puVar5 + -0x1a) = 0;
      *(undefined8 *)(puVar5 + -0x18) = 0;
      *(undefined8 *)(puVar5 + -0x16) = 0;
      *(undefined8 *)(puVar5 + -0x14) = 0;
      *(undefined8 *)(puVar5 + -0x12) = 0;
      *(undefined8 *)(puVar5 + -0x10) = 0;
      *(undefined8 *)(puVar5 + -0xe) = 0;
      *(undefined8 *)(puVar5 + -8) = 0;
      *(undefined8 *)(puVar5 + -6) = 0;
      *(undefined8 *)((long)puVar5 + -0x13) = 0;
      *(undefined8 *)(puVar5 + -0xc) = 0;
      *(undefined8 *)(puVar5 + -10) = 0;
      *puVar5 = 0;
      puVar5 = puVar5 + 0x21;
    }
    pVar7 = (long)newMem - (long)this->data;
    spx_free<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&this->data);
    this->data = newMem;
    this->themax = uVar1;
    this->thesize = uVar2;
  }
  return pVar7;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }